

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O1

int __thiscall QtMWidgets::PageControlPrivate::findButton(PageControlPrivate *this,QPoint *pos)

{
  char cVar1;
  reference pQVar2;
  long i;
  
  if (0 < this->count) {
    i = 0;
    do {
      pQVar2 = QList<QRect>::operator[](&this->rectangles,i);
      cVar1 = QRect::contains((QPoint *)pQVar2,SUB81(pos,0));
      if (cVar1 != '\0') {
        return (int)i;
      }
      i = i + 1;
    } while (i < this->count);
  }
  return -1;
}

Assistant:

int
PageControlPrivate::findButton( const QPoint & pos )
{
	for( int i = 0; i < count; ++i )
	{
		if( rectangles[ i ].contains( pos ) )
			return i;
	}

	return -1;
}